

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

int __thiscall
de::BlockBuffer<unsigned_char>::writeToCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  deBool dVar4;
  int iVar5;
  BufferCanceledException *this_00;
  int local_50;
  int ndx;
  int numToWrite;
  uchar *block;
  bool blocking_local;
  uchar *elements_local;
  int numElements_local;
  BlockBuffer<unsigned_char> *this_local;
  
  if (this->m_writePos == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_empty);
    }
    else {
      dVar4 = deSemaphore_tryDecrement(this->m_empty);
      if (dVar4 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_empty);
      Mutex::unlock(&this->m_writeLock);
      this_00 = (BufferCanceledException *)__cxa_allocate_exception(8);
      BufferCanceledException::BufferCanceledException(this_00);
      __cxa_throw(this_00,&BufferCanceledException::typeinfo,
                  BufferCanceledException::~BufferCanceledException);
    }
  }
  puVar3 = this->m_elements;
  iVar1 = this->m_writeBlock;
  iVar2 = this->m_blockSize;
  iVar5 = min<int>(numElements,this->m_blockSize - this->m_writePos);
  for (local_50 = 0; local_50 < iVar5; local_50 = local_50 + 1) {
    puVar3[(long)(this->m_writePos + local_50) + (long)(iVar1 * iVar2)] = elements[local_50];
  }
  this->m_writePos = iVar5 + this->m_writePos;
  if (this->m_writePos == this->m_blockSize) {
    flushWriteBlock(this);
  }
  return iVar5;
}

Assistant:

int BlockBuffer<T>::writeToCurrentBlock (int numElements, const T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_writePos == 0)
	{
		/* Write thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_empty);
		else
		{
			if (!deSemaphore_tryDecrement(m_empty))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that write lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_empty);
			m_writeLock.unlock();
			throw CanceledException();
		}
	}

	/* Write thread owns current block. */
	T*		block			= m_elements + m_writeBlock*m_blockSize;
	int		numToWrite		= de::min(numElements, m_blockSize-m_writePos);

	DE_ASSERT(numToWrite > 0);

	for (int ndx = 0; ndx < numToWrite; ndx++)
		block[m_writePos+ndx] = elements[ndx];

	m_writePos += numToWrite;

	if (m_writePos == m_blockSize)
		flushWriteBlock(); /* Flush current write block. */

	return numToWrite;
}